

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReshapeStaticLayerParams::InternalSwap
          (ReshapeStaticLayerParams *this,ReshapeStaticLayerParams *other)

{
  ReshapeStaticLayerParams *other_local;
  ReshapeStaticLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<long>::InternalSwap(&this->targetshape_,&other->targetshape_);
  return;
}

Assistant:

void ReshapeStaticLayerParams::InternalSwap(ReshapeStaticLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  targetshape_.InternalSwap(&other->targetshape_);
}